

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

int __thiscall cg_other::operator()(cg_other *this,point p)

{
  pointer pcVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  pcVar1 = (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->data).
                super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if (lVar4 != 0) {
    uVar2 = (lVar4 >> 2) * -0x5555555555555555;
    uVar3 = 1;
    uVar5 = 0;
    do {
      if (pcVar1[uVar5].p == p) {
        return pcVar1[uVar5].ch;
      }
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  return -1;
}

Assistant:

int cg_other::operator()(point p) {
    for (unsigned i = 0; i < data.size(); i++) {
        if (data[i].p == p) return data[i].ch;
    }
    return -1;
}